

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O1

void __thiscall edk2_vss2_t::vss2_variable_attributes_t::_read(vss2_variable_attributes_t *this)

{
  uint64_t uVar1;
  
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_non_volatile = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_boot_service = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_runtime = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_hw_error_record = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_auth_write = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_time_based_auth = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,1);
  this->m_append_write = uVar1 != 0;
  uVar1 = kaitai::kstream::read_bits_int_le((this->super_kstruct).m__io,0x19);
  this->m_reserved = uVar1;
  return;
}

Assistant:

void edk2_vss2_t::vss2_variable_attributes_t::_read() {
    m_non_volatile = m__io->read_bits_int_le(1);
    m_boot_service = m__io->read_bits_int_le(1);
    m_runtime = m__io->read_bits_int_le(1);
    m_hw_error_record = m__io->read_bits_int_le(1);
    m_auth_write = m__io->read_bits_int_le(1);
    m_time_based_auth = m__io->read_bits_int_le(1);
    m_append_write = m__io->read_bits_int_le(1);
    m_reserved = m__io->read_bits_int_le(25);
}